

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O3

Aig_Man_t * Saig_ManRetimeDupInitState(Aig_Man_t *p,Vec_Ptr_t *vCut)

{
  void *pvVar1;
  uint uVar2;
  Aig_Man_t *p_00;
  Aig_Obj_t *pAVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  
  p_00 = Aig_ManStart(p->vObjs->nSize);
  Aig_ManCleanData(p);
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  if (0 < vCut->nSize) {
    lVar5 = 0;
    do {
      pvVar1 = vCut->pArray[lVar5];
      pAVar3 = Aig_ObjCreateCi(p_00);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar3;
      lVar5 = lVar5 + 1;
    } while (lVar5 < vCut->nSize);
  }
  if (0 < p->nRegs) {
    iVar6 = 0;
    do {
      uVar2 = p->nTruePos + iVar6;
      if (((int)uVar2 < 0) || (p->vCos->nSize <= (int)uVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = p->vCos->pArray[uVar2];
      Saig_ManRetimeDup_rec(p_00,(Aig_Obj_t *)(*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe));
      if (((ulong)pvVar1 & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar4 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
      if (uVar4 == 0) {
        pAVar3 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar3 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar4 + 0x28));
      }
      Aig_ObjCreateCo(p_00,pAVar3);
      iVar6 = iVar6 + 1;
    } while (iVar6 < p->nRegs);
  }
  return p_00;
}

Assistant:

Aig_Man_t * Saig_ManRetimeDupInitState( Aig_Man_t * p, Vec_Ptr_t * vCut )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    // mark the cones under the cut
//    assert( Vec_PtrSize(vCut) == Saig_ManRetimeCountCut(p, vCut) );
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    // create the true PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    // create the registers
    Vec_PtrForEachEntry( Aig_Obj_t *, vCut, pObj, i )
        pObj->pData = Aig_ObjCreateCi(pNew);
    // duplicate logic above the cut and create POs
    Saig_ManForEachLi( p, pObj, i )
    {
        Saig_ManRetimeDup_rec( pNew, Aig_ObjFanin0(pObj) );
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    }
    return pNew;
}